

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O1

bool ZeroKeyTest<Blob<256>>(pfHash hash,bool drawDiagram)

{
  bool bVar1;
  void *__s;
  long lVar2;
  int i;
  long lVar3;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> hashes;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> local_48;
  
  printf("Keyset \'Zeroes\' - %d keys\n");
  __s = operator_new__(0x32000);
  memset(__s,0,0x32000);
  local_48.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::resize(&local_48,0x32000);
  lVar2 = 0;
  lVar3 = 0;
  do {
    (*hash)(__s,(int)lVar3,0,
            (local_48.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
             super__Vector_impl_data._M_start)->bytes + lVar2);
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 0x20;
  } while (lVar3 != 0x32000);
  bVar1 = TestHashList<Blob<256>>(&local_48,drawDiagram,true,true,true,true);
  putchar(10);
  operator_delete__(__s);
  if (local_48.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool ZeroKeyTest ( pfHash hash, bool drawDiagram )
{
  int keycount = 200*1024;

  printf("Keyset 'Zeroes' - %d keys\n",keycount);

  unsigned char * nullblock = new unsigned char[keycount];
  memset(nullblock,0,keycount);

  //----------

  std::vector<hashtype> hashes;

  hashes.resize(keycount);

  for(int i = 0; i < keycount; i++)
  {
    hash(nullblock,i,0,&hashes[i]);
  }

  bool result = true;

  result &= TestHashList(hashes,drawDiagram);

  printf("\n");

  delete [] nullblock;

  return result;
}